

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_err_t flat_file_scan(ion_flat_file_t *flat_file,ion_fpos_t start_location,ion_fpos_t *location,
                        ion_flat_file_row_t *row,ion_byte_t scan_direction,
                        ion_flat_file_predicate_t predicate,...)

{
  char in_AL;
  ion_boolean_t iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int local_188;
  size_t local_168;
  long local_160;
  undefined1 local_158 [48];
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined1 local_99;
  undefined1 local_98 [7];
  ion_boolean_t predicate_test;
  va_list predicate_arguments;
  size_t cur_rec;
  int32_t i;
  size_t records_left;
  size_t num_records_to_process;
  ion_fpos_t prev_offset;
  ion_fpos_t end_offset;
  ion_fpos_t cur_offset;
  ion_flat_file_predicate_t predicate_local;
  ion_byte_t scan_direction_local;
  ion_flat_file_row_t *row_local;
  ion_fpos_t *location_local;
  ion_fpos_t start_location_local;
  ion_flat_file_t *flat_file_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  end_offset = flat_file->start_of_data + start_location * flat_file->row_size;
  if (scan_direction == '\x01') {
    local_160 = flat_file->eof_position;
  }
  else {
    local_160 = flat_file->start_of_data;
  }
  if (start_location == -1) {
    if (scan_direction == '\x01') {
      end_offset = flat_file->start_of_data;
    }
    else {
      end_offset = flat_file->eof_position;
    }
  }
  if ((scan_direction == '\0') && (end_offset != flat_file->eof_position)) {
    end_offset = flat_file->row_size + end_offset;
  }
  if ((flat_file->eof_position < end_offset) || (end_offset < flat_file->start_of_data)) {
    flat_file_local._7_1_ = '\x13';
  }
  else {
    while (end_offset != local_160) {
      iVar2 = fseek((FILE *)flat_file->data_file,end_offset,0);
      if (iVar2 != 0) {
        return '\r';
      }
      num_records_to_process = end_offset;
      records_left = (size_t)flat_file->num_buffered;
      if (scan_direction == '\x01') {
        local_168 = (ulong)(local_160 - end_offset) / flat_file->row_size;
        if (flat_file->num_buffered < local_168) {
          local_168 = (size_t)flat_file->num_buffered;
        }
        records_left = local_168;
        sVar3 = fread(flat_file->buffer,flat_file->row_size,local_168,(FILE *)flat_file->data_file);
        if (local_168 != sVar3) {
          return '\b';
        }
        end_offset = ftell((FILE *)flat_file->data_file);
        if (end_offset == -1) {
          return '\b';
        }
      }
      else {
        end_offset = end_offset - flat_file->row_size * (ulong)flat_file->num_buffered;
        if (end_offset < flat_file->start_of_data) {
          records_left = (ulong)flat_file->num_buffered -
                         (ulong)(flat_file->start_of_data - end_offset) / flat_file->row_size;
          end_offset = flat_file->start_of_data;
        }
        iVar2 = fseek((FILE *)flat_file->data_file,end_offset,0);
        if (iVar2 != 0) {
          return '\r';
        }
        sVar3 = fread(flat_file->buffer,flat_file->row_size,records_left,
                      (FILE *)flat_file->data_file);
        if (records_left != sVar3) {
          return '\b';
        }
        num_records_to_process = end_offset;
      }
      flat_file->current_loaded_region =
           (num_records_to_process - flat_file->start_of_data) / flat_file->row_size;
      flat_file->num_in_buffer = records_left;
      if (scan_direction == '\x01') {
        local_188 = 0;
      }
      else {
        local_188 = (int)records_left + -1;
      }
      cur_rec._4_4_ = local_188;
      while( true ) {
        if (scan_direction == '\x01') {
          bVar5 = (ulong)(long)cur_rec._4_4_ < records_left;
        }
        else {
          bVar5 = -1 < cur_rec._4_4_;
        }
        if (!bVar5) break;
        lVar4 = (long)cur_rec._4_4_ * flat_file->row_size;
        row->row_status = flat_file->buffer[lVar4];
        row->key = flat_file->buffer + lVar4 + 1;
        row->value = flat_file->buffer + lVar4 + 1 + (long)(flat_file->super).record.key_size;
        predicate_arguments[0].overflow_arg_area = local_158;
        predicate_arguments[0]._0_8_ = &stack0x00000008;
        stack0xffffffffffffff6c = 0x30;
        local_98._0_4_ = 0x30;
        iVar1 = (*predicate)(flat_file,row,(va_list *)local_98);
        if (iVar1 != '\0') {
          *location = (num_records_to_process - flat_file->start_of_data) / flat_file->row_size +
                      (long)cur_rec._4_4_;
          return '\0';
        }
        if (scan_direction == '\x01') {
          cur_rec._4_4_ = cur_rec._4_4_ + 1;
        }
        else {
          cur_rec._4_4_ = cur_rec._4_4_ + -1;
        }
        local_99 = 0;
      }
    }
    *location = (ulong)(flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size;
    flat_file_local._7_1_ = '\x0e';
  }
  return flat_file_local._7_1_;
}

Assistant:

ion_err_t
flat_file_scan(
	ion_flat_file_t				*flat_file,
	ion_fpos_t					start_location,
	ion_fpos_t					*location,
	ion_flat_file_row_t			*row,
	ion_byte_t					scan_direction,
	ion_flat_file_predicate_t	predicate,
	...
) {
	ion_fpos_t	cur_offset	= flat_file->start_of_data + start_location * flat_file->row_size;
	ion_fpos_t	end_offset	= ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? flat_file->eof_position : flat_file->start_of_data;

	if (-1 == start_location) {
		if (ION_FLAT_FILE_SCAN_FORWARDS == scan_direction) {
			cur_offset = flat_file->start_of_data;
		}
		else {
			cur_offset = flat_file->eof_position;
		}
	}

	/* If we're scanning backwards, bump the cur_offset up one record so that we read the record we're sitting on. */
	/* We don't do this if we're positioned at the EOF, since otherwise we would read garbage. */
	if ((ION_FLAT_FILE_SCAN_BACKWARDS == scan_direction) && (cur_offset != flat_file->eof_position)) {
		cur_offset += flat_file->row_size;
	}

	if ((cur_offset > flat_file->eof_position) || (cur_offset < flat_file->start_of_data)) {
		return err_out_of_bounds;
	}

	while (cur_offset != end_offset) {
		if (0 != fseek(flat_file->data_file, cur_offset, SEEK_SET)) {
			return err_file_bad_seek;
		}

		/* We set cur_offset to be the next block to read after this next code segment, so */
		/* we need t save what block we're currently reading now for location calculation purposes */
		ion_fpos_t	prev_offset				= cur_offset;
		size_t		num_records_to_process	= flat_file->num_buffered;

		if (ION_FLAT_FILE_SCAN_FORWARDS == scan_direction) {
			/* It's possible for this to do a partial read (if you're close to EOF), calculate how many we need to read */
			size_t records_left = (end_offset - cur_offset) / flat_file->row_size;

			num_records_to_process = records_left > (unsigned) flat_file->num_buffered ? (unsigned) flat_file->num_buffered : records_left;

			if (num_records_to_process != fread(flat_file->buffer, flat_file->row_size, num_records_to_process, flat_file->data_file)) {
				return err_file_read_error;
			}

			if (-1 == (cur_offset = ftell(flat_file->data_file))) {
				return err_file_read_error;
			}
		}
		else {
			/* Move the offset pointer to the next read location, clamp it at start_of_file if we go too far. */
			cur_offset -= flat_file->row_size * flat_file->num_buffered;

			if (cur_offset < flat_file->start_of_data) {
				/* We know how many rows we went past the start of file, calculate it so we don't fread too much */
				num_records_to_process	= flat_file->num_buffered - (flat_file->start_of_data - cur_offset) / flat_file->row_size;
				cur_offset				= flat_file->start_of_data;
			}

			if (0 != fseek(flat_file->data_file, cur_offset, SEEK_SET)) {
				return err_file_bad_seek;
			}

			if (num_records_to_process != fread(flat_file->buffer, flat_file->row_size, num_records_to_process, flat_file->data_file)) {
				return err_file_read_error;
			}

			/* In this case, the prev_offset is actually the cur_offset. */
			prev_offset = cur_offset;
		}

		flat_file->current_loaded_region	= (prev_offset - flat_file->start_of_data) / flat_file->row_size;
		flat_file->num_in_buffer			= num_records_to_process;

		int32_t i;

		for (i = ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? 0 : num_records_to_process - 1; ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? (size_t) i < num_records_to_process : i >= 0; ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? i++ : i--) {
			size_t cur_rec = i * flat_file->row_size;

			/* This cast is done because in the future, the status could possibly be a non-byte type */
			row->row_status = *((ion_flat_file_row_status_t *) &flat_file->buffer[cur_rec]);
			row->key		= &flat_file->buffer[cur_rec + sizeof(ion_flat_file_row_status_t)];
			row->value		= &flat_file->buffer[cur_rec + sizeof(ion_flat_file_row_status_t) + flat_file->super.record.key_size];

			va_list predicate_arguments;

			va_start(predicate_arguments, predicate);

			ion_boolean_t predicate_test = predicate(flat_file, row, &predicate_arguments);

			va_end(predicate_arguments);

			if (predicate_test) {
				*location = (prev_offset - flat_file->start_of_data) / flat_file->row_size + i;
				return err_ok;
			}
		}
	}

	/* If we reach this point, then no row matched the predicate. */
	*location = (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size;
	return err_file_hit_eof;
}